

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O3

void __thiscall
Assimp::BlenderImporter::ConvertMesh
          (BlenderImporter *this,Scene *param_1,Object *param_2,Mesh *mesh,ConversionData *conv_data
          ,TempArray<std::vector,_aiMesh> *temp)

{
  key_type_conflict *__k;
  _Rb_tree_color _Var1;
  pointer pMVar2;
  pointer pMVar3;
  pointer ppaVar4;
  aiMesh *paVar5;
  _Base_ptr p_Var6;
  pointer psVar7;
  _Elt_pointer psVar8;
  _Map_pointer ppsVar9;
  pointer pMVar10;
  pointer pMVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pMVar12;
  pointer pMVar13;
  pointer pMVar14;
  mapped_type pMVar15;
  pointer pTVar16;
  pointer pTVar17;
  pointer pMVar18;
  pointer pMVar19;
  pointer pMVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  _Rb_tree_color _Var24;
  mapped_type_conflict3 *pmVar25;
  pointer pcVar26;
  ulong uVar27;
  aiVector3D *paVar28;
  ulong *puVar29;
  aiFace *paVar30;
  size_t sVar31;
  pointer psVar32;
  _Base_ptr p_Var33;
  uint *puVar34;
  long lVar35;
  ElemBase *pEVar36;
  mapped_type *ppMVar37;
  aiColor4D *paVar38;
  uint uVar39;
  aiFace *paVar40;
  ulong uVar41;
  _Rb_tree_node_base *p_Var42;
  char *pcVar43;
  long *plVar44;
  uint uVar45;
  uint uVar46;
  ulong uVar47;
  pointer ppaVar48;
  long lVar49;
  aiVector3D *paVar50;
  long lVar51;
  _Rb_tree_node_base *p_Var52;
  _Rb_tree_node_base *p_Var53;
  long lVar54;
  long lVar55;
  MaterialTextureUVMappings matTexUvMappings;
  shared_ptr<Assimp::Blender::Material> mat;
  iterator has;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  mat_num_to_mesh_idx;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  per_mat;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  per_mat_verts;
  undefined1 local_538 [8];
  _Rb_tree_node_base _Stack_530;
  size_t local_510;
  value_type local_508;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
  local_4f8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  local_4c8;
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  local_498;
  undefined1 local_468 [8];
  undefined1 auStack_460 [1024];
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  local_60;
  
  if ((((long)mesh->totface != 0) || (mesh->totloop != 0)) && (iVar23 = mesh->totvert, iVar23 != 0))
  {
    psVar8 = (_Elt_pointer)(auStack_460 + 8);
    if ((ulong)(((long)(mesh->mface).
                       super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       .
                       super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(mesh->mface).
                       super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       .
                       super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) <
        (ulong)(long)mesh->totface) {
      local_468 = (undefined1  [8])psVar8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Number of faces is larger than the corresponding array","");
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
      if (local_468 != (undefined1  [8])psVar8) {
        operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
      }
      iVar23 = mesh->totvert;
    }
    if ((ulong)(((long)(mesh->mvert).
                       super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       .
                       super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(mesh->mvert).
                       super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       .
                       super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) <
        (ulong)(long)iVar23) {
      local_468 = (undefined1  [8])psVar8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Number of vertices is larger than the corresponding array","")
      ;
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
      if (local_468 != (undefined1  [8])psVar8) {
        operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
      }
    }
    if ((ulong)(((long)(mesh->mloop).
                       super_vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       .
                       super__Vector_base<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(mesh->mloop).
                       super_vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       .
                       super__Vector_base<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
        (ulong)(long)mesh->totloop) {
      local_468 = (undefined1  [8])psVar8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Number of vertices is larger than the corresponding array","")
      ;
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
      if (local_468 != (undefined1  [8])psVar8) {
        operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
      }
    }
    local_498._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_498._M_impl.super__Rb_tree_header._M_header;
    local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_498._M_impl.super__Rb_tree_header._M_header._M_right =
         local_498._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < mesh->totface) {
      lVar54 = 0x20;
      lVar49 = 0;
      do {
        pMVar2 = (mesh->mface).
                 super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>.
                 super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __k = (key_type_conflict *)((long)&(pMVar2->super_ElemBase)._vptr_ElemBase + lVar54);
        pmVar25 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_498,__k);
        *pmVar25 = *pmVar25 + 1;
        iVar23 = *(int *)((long)pMVar2 + lVar54 + -4);
        pmVar25 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_60,__k);
        *pmVar25 = (*pmVar25 - (ulong)(iVar23 == 0)) + 4;
        lVar49 = lVar49 + 1;
        lVar54 = lVar54 + 0x28;
      } while (lVar49 < mesh->totface);
    }
    if (0 < mesh->totpoly) {
      lVar49 = 0x18;
      lVar54 = 0;
      do {
        pMVar3 = (mesh->mpoly).
                 super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                 super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_468._0_4_ = (int)*(short *)((long)&(pMVar3->super_ElemBase)._vptr_ElemBase + lVar49);
        pmVar25 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_498,(key_type_conflict *)local_468);
        *pmVar25 = *pmVar25 + 1;
        iVar23 = *(int *)((long)pMVar3 + lVar49 + -4);
        local_468._0_4_ = (int)*(short *)((long)&(pMVar3->super_ElemBase)._vptr_ElemBase + lVar49);
        pmVar25 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_60,(key_type_conflict *)local_468);
        *pmVar25 = *pmVar25 + (long)iVar23;
        lVar54 = lVar54 + 1;
        lVar49 = lVar49 + 0x20;
      } while (lVar54 < mesh->totpoly);
    }
    lVar49 = (long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&temp->arr,(lVar49 >> 3) + local_498._M_impl.super__Rb_tree_header._M_node_count);
    local_4c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_4c8._M_impl.super__Rb_tree_header._M_header;
    local_4c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_4c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_4c8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_4c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    if ((_Rb_tree_header *)local_498._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_498._M_impl.super__Rb_tree_header) {
      pcVar43 = (mesh->id).name + 2;
      p_Var33 = local_498._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        ppaVar48 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppaVar4 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_468 = (undefined1  [8])(long)(int)p_Var33[1]._M_color;
        pmVar25 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&local_4c8,(key_type_conflict1 *)local_468);
        *pmVar25 = (long)ppaVar4 - (long)ppaVar48 >> 3;
        pcVar26 = (pointer)operator_new(0x520);
        pcVar26[0] = '\0';
        pcVar26[1] = '\0';
        pcVar26[2] = '\0';
        pcVar26[3] = '\0';
        pcVar26[4] = '\0';
        pcVar26[5] = '\0';
        pcVar26[6] = '\0';
        pcVar26[7] = '\0';
        pcVar26[8] = '\0';
        pcVar26[9] = '\0';
        pcVar26[10] = '\0';
        pcVar26[0xb] = '\0';
        memset(pcVar26 + 0x10,0,0xcc);
        pcVar26[0xe0] = '\0';
        pcVar26[0xe1] = '\0';
        pcVar26[0xe2] = '\0';
        pcVar26[0xe3] = '\0';
        pcVar26[0xe4] = '\0';
        pcVar26[0xe5] = '\0';
        pcVar26[0xe6] = '\0';
        pcVar26[0xe7] = '\0';
        pcVar26[0xe8] = '\0';
        pcVar26[0xe9] = '\0';
        pcVar26[0xea] = '\0';
        pcVar26[0xeb] = '\0';
        pcVar26[0xec] = '\0';
        pcVar26[0xed] = '\0';
        pcVar26[0xee] = '\0';
        pcVar26[0xef] = '\0';
        pcVar26[0xf0] = '\0';
        memset(pcVar26 + 0xf1,0x1b,0x3ff);
        pcVar26[0x4f0] = '\0';
        pcVar26[0x4f1] = '\0';
        pcVar26[0x4f2] = '\0';
        pcVar26[0x4f3] = '\0';
        pcVar26[0x4f8] = '\0';
        pcVar26[0x4f9] = '\0';
        pcVar26[0x4fa] = '\0';
        pcVar26[0x4fb] = '\0';
        pcVar26[0x4fc] = '\0';
        pcVar26[0x4fd] = '\0';
        pcVar26[0x4fe] = '\0';
        pcVar26[0x4ff] = '\0';
        pcVar26[0x500] = '\0';
        pcVar26[0x501] = '\0';
        pcVar26[0x502] = '\0';
        pcVar26[0x503] = '\0';
        pcVar26[0x504] = '\0';
        pcVar26[0x505] = '\0';
        pcVar26[0x506] = '\0';
        pcVar26[0x507] = '\0';
        pcVar26[0x508] = '\0';
        pcVar26[0x509] = '\0';
        pcVar26[0x50a] = '\0';
        pcVar26[0x50b] = '\0';
        pcVar26[0x50c] = '\0';
        pcVar26[0x50d] = '\0';
        pcVar26[0x50e] = '\0';
        pcVar26[0x50f] = '\0';
        pcVar26[0x510] = '\0';
        pcVar26[0x511] = '\0';
        pcVar26[0x512] = '\0';
        pcVar26[0x513] = '\0';
        pcVar26[0x514] = '\0';
        pcVar26[0x515] = '\0';
        pcVar26[0x516] = '\0';
        pcVar26[0x517] = '\0';
        pcVar26[0x518] = '\0';
        pcVar26[0x519] = '\0';
        pcVar26[0x51a] = '\0';
        pcVar26[0x51b] = '\0';
        memset(pcVar26 + 0x30,0,0xa0);
        local_468 = (undefined1  [8])pcVar26;
        std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                  ((vector<aiMesh*,std::allocator<aiMesh*>> *)temp,(aiMesh **)local_468);
        p_Var53 = p_Var33 + 1;
        paVar5 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
        pmVar25 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_60,(key_type_conflict *)p_Var53);
        uVar41 = *pmVar25;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar41;
        uVar27 = SUB168(auVar21 * ZEXT816(0xc),0);
        uVar47 = uVar27;
        if (SUB168(auVar21 * ZEXT816(0xc),8) != 0) {
          uVar47 = 0xffffffffffffffff;
        }
        paVar28 = (aiVector3D *)operator_new__(uVar47);
        if (uVar41 != 0) {
          memset(paVar28,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar5->mVertices = paVar28;
        pmVar25 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&local_60,(key_type_conflict *)p_Var53);
        uVar41 = *pmVar25;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar41;
        uVar47 = SUB168(auVar22 * ZEXT816(0xc),0);
        if (SUB168(auVar22 * ZEXT816(0xc),8) != 0) {
          uVar47 = 0xffffffffffffffff;
        }
        paVar28 = (aiVector3D *)operator_new__(uVar47);
        if (uVar41 != 0) {
          memset(paVar28,0,((uVar41 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar5->mNormals = paVar28;
        p_Var6 = p_Var33[1]._M_parent;
        puVar29 = (ulong *)operator_new__(-(ulong)((ulong)p_Var6 >> 0x3c != 0) | (long)p_Var6 * 0x10
                                          | 8);
        *puVar29 = (ulong)p_Var6;
        paVar30 = (aiFace *)(puVar29 + 1);
        if (p_Var6 != (_Base_ptr)0x0) {
          paVar40 = paVar30;
          do {
            paVar40->mNumIndices = 0;
            paVar40->mIndices = (uint *)0x0;
            paVar40 = paVar40 + 1;
          } while (paVar40 != paVar30 + (long)p_Var6);
        }
        paVar5->mFaces = paVar30;
        local_538 = (undefined1  [8])&_Stack_530._M_parent;
        sVar31 = strlen(pcVar43);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_538,pcVar43,pcVar43 + sVar31);
        sVar31 = _Stack_530._0_8_ & 0xffffffff;
        if ((_Stack_530._0_8_ & 0xfffffc00) != 0) {
          sVar31 = 0x3ff;
        }
        local_468._0_4_ = (ai_uint32)sVar31;
        memcpy(local_468 + 4,(void *)local_538,sVar31);
        local_468[sVar31 + 4] = 0;
        (paVar5->mName).length = (ai_uint32)sVar31;
        memcpy((paVar5->mName).data,local_468 + 4,sVar31);
        (paVar5->mName).data[sVar31] = '\0';
        if (local_538 != (undefined1  [8])&_Stack_530._M_parent) {
          operator_delete((void *)local_538,
                          (ulong)((long)&((__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                                           *)&(_Stack_530._M_parent)->_M_color)->_M_ptr + 1));
        }
        psVar32 = (mesh->mat).
                  super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                  .
                  super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar7 = (mesh->mat).
                 super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 .
                 super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar32 == psVar7) {
          paVar5->mMaterialIndex = 0xffffffff;
        }
        else {
          uVar41 = (ulong)(int)p_Var53->_M_color;
          if ((ulong)((long)psVar7 - (long)psVar32 >> 4) <= uVar41) {
            local_468 = (undefined1  [8])(auStack_460 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_468,"Material index is out of range","");
            LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
            if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
              operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
            }
            uVar41 = (ulong)(int)p_Var53->_M_color;
            psVar32 = (mesh->mat).
                      super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                      .
                      super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = psVar32[uVar41].
                 super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               psVar32[uVar41].
               super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
          if (local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_508.
                    super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_508.
                    super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_468 = (undefined1  [8])
                      (conv_data->materials_raw).
                      super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur;
          auStack_460._0_8_ =
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
          auStack_460._8_8_ =
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
          auStack_460._16_8_ =
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
          local_538 = (undefined1  [8])
                      (conv_data->materials_raw).
                      super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          _Stack_530._0_8_ =
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
          _Stack_530._M_parent =
               (_Base_ptr)
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last;
          _Stack_530._M_left =
               (_Base_ptr)
               (conv_data->materials_raw).
               super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
          std::
          __find_if<std::_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,std::shared_ptr<Assimp::Blender::Material>&,std::shared_ptr<Assimp::Blender::Material>*>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Assimp::Blender::Material>const>>
                    (&local_4f8,(string *)local_468,local_538,&local_508);
          psVar8 = (conv_data->materials_raw).
                   super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if ((_Elt_pointer)local_4f8._M_impl._0_8_ == psVar8) {
            ppsVar9 = (conv_data->materials_raw).
                      super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node;
            paVar5->mMaterialIndex =
                 (int)((ulong)((long)(conv_data->materials_raw).
                                     super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_last -
                              (long)(conv_data->materials_raw).
                                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) +
                 (int)((ulong)((long)psVar8 -
                              (long)(conv_data->materials_raw).
                                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) +
                 ((((uint)((int)ppsVar9 -
                          *(int *)&(conv_data->materials_raw).
                                   super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                 (uint)(ppsVar9 == (_Map_pointer)0x0)) * 0x20;
            std::
            deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
            ::push_back(&conv_data->materials_raw,&local_508);
          }
          else {
            paVar5->mMaterialIndex =
                 (int)((ulong)(local_4f8._M_impl._0_8_ -
                              CONCAT44(local_4f8._M_impl.super__Rb_tree_header._M_header._4_4_,
                                       local_4f8._M_impl.super__Rb_tree_header._M_header._M_color))
                      >> 4) +
                 (int)((ulong)((long)(conv_data->materials_raw).
                                     super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_last -
                              (long)(conv_data->materials_raw).
                                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) +
                 ((((uint)((int)local_4f8._M_impl.super__Rb_tree_header._M_header._M_left -
                          *(int *)&(conv_data->materials_raw).
                                   super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                 (uint)(local_4f8._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0)
                 ) * 0x20;
          }
          if (local_508.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_508.
                       super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        p_Var33 = (_Base_ptr)std::_Rb_tree_increment(p_Var33);
      } while ((_Rb_tree_header *)p_Var33 != &local_498._M_impl.super__Rb_tree_header);
    }
    if (0 < mesh->totface) {
      lVar54 = 0x20;
      lVar55 = 0;
      do {
        pMVar2 = (mesh->mface).
                 super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>.
                 super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_468 = (undefined1  [8])
                    (long)*(int *)((long)&(pMVar2->super_ElemBase)._vptr_ElemBase + lVar54);
        pmVar25 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&local_4c8,(key_type_conflict1 *)local_468);
        paVar5 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start[*pmVar25];
        paVar30 = paVar5->mFaces;
        uVar39 = paVar5->mNumFaces;
        paVar5->mNumFaces = uVar39 + 1;
        uVar45 = 4 - (*(int *)((long)pMVar2 + lVar54 + -4) == 0);
        paVar30[uVar39].mNumIndices = uVar45;
        puVar34 = (uint *)operator_new__((ulong)(uVar45 * 4));
        paVar30[uVar39].mIndices = puVar34;
        paVar28 = paVar5->mVertices + paVar5->mNumVertices;
        paVar50 = paVar5->mNormals + paVar5->mNumVertices;
        iVar23 = *(int *)((long)pMVar2 + lVar54 + -0x10);
        psVar8 = (_Elt_pointer)(auStack_460 + 8);
        if (mesh->totvert <= iVar23) {
          local_468 = (undefined1  [8])psVar8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"Vertex index v1 out of range","");
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
          if (local_468 != (undefined1  [8])psVar8) {
            operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
          }
          iVar23 = *(int *)((long)pMVar2 + lVar54 + -0x10);
        }
        pMVar10 = (mesh->mvert).
                  super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                  super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar28->x = pMVar10[iVar23].co[0];
        paVar28->y = pMVar10[iVar23].co[1];
        paVar28->z = pMVar10[iVar23].co[2];
        paVar50->x = pMVar10[iVar23].no[0];
        paVar50->y = pMVar10[iVar23].no[1];
        paVar50->z = pMVar10[iVar23].no[2];
        uVar45 = paVar5->mNumVertices;
        paVar5->mNumVertices = uVar45 + 1;
        *paVar30[uVar39].mIndices = uVar45;
        iVar23 = *(int *)((long)pMVar2 + lVar54 + -0xc);
        if (mesh->totvert <= iVar23) {
          local_468 = (undefined1  [8])psVar8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"Vertex index v2 out of range","");
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
          if (local_468 != (undefined1  [8])psVar8) {
            operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
          }
          iVar23 = *(int *)((long)pMVar2 + lVar54 + -0xc);
        }
        pMVar10 = (mesh->mvert).
                  super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                  super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar28[1].x = pMVar10[iVar23].co[0];
        paVar28[1].y = pMVar10[iVar23].co[1];
        paVar28[1].z = pMVar10[iVar23].co[2];
        paVar50[1].x = pMVar10[iVar23].no[0];
        paVar50[1].y = pMVar10[iVar23].no[1];
        paVar50[1].z = pMVar10[iVar23].no[2];
        uVar45 = paVar5->mNumVertices;
        paVar5->mNumVertices = uVar45 + 1;
        paVar30[uVar39].mIndices[1] = uVar45;
        iVar23 = *(int *)((long)pMVar2 + lVar54 + -8);
        if (mesh->totvert <= iVar23) {
          local_468 = (undefined1  [8])psVar8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"Vertex index v3 out of range","");
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
          if (local_468 != (undefined1  [8])psVar8) {
            operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
          }
          iVar23 = *(int *)((long)pMVar2 + lVar54 + -8);
        }
        pMVar10 = (mesh->mvert).
                  super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                  super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar28[2].x = pMVar10[iVar23].co[0];
        paVar28[2].y = pMVar10[iVar23].co[1];
        paVar28[2].z = pMVar10[iVar23].co[2];
        paVar50[2].x = pMVar10[iVar23].no[0];
        paVar50[2].y = pMVar10[iVar23].no[1];
        paVar50[2].z = pMVar10[iVar23].no[2];
        uVar45 = paVar5->mNumVertices;
        paVar5->mNumVertices = uVar45 + 1;
        paVar30[uVar39].mIndices[2] = uVar45;
        iVar23 = *(int *)((long)pMVar2 + lVar54 + -4);
        if (mesh->totvert <= iVar23) {
          local_468 = (undefined1  [8])psVar8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"Vertex index v4 out of range","");
          LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
          if (local_468 != (undefined1  [8])psVar8) {
            operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
          }
          iVar23 = *(int *)((long)pMVar2 + lVar54 + -4);
        }
        if (iVar23 == 0) {
          uVar39 = 4;
        }
        else {
          pMVar10 = (mesh->mvert).
                    super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                    super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar28[3].x = pMVar10[iVar23].co[0];
          paVar28[3].y = pMVar10[iVar23].co[1];
          paVar28[3].z = pMVar10[iVar23].co[2];
          paVar50[3].x = pMVar10[iVar23].no[0];
          paVar50[3].y = pMVar10[iVar23].no[1];
          paVar50[3].z = pMVar10[iVar23].no[2];
          uVar45 = paVar5->mNumVertices;
          paVar5->mNumVertices = uVar45 + 1;
          paVar30[uVar39].mIndices[3] = uVar45;
          uVar39 = 8;
        }
        paVar5->mPrimitiveTypes = paVar5->mPrimitiveTypes | uVar39;
        lVar55 = lVar55 + 1;
        lVar54 = lVar54 + 0x28;
      } while (lVar55 < mesh->totface);
    }
    if (0 < mesh->totpoly) {
      lVar54 = 0;
      do {
        pMVar3 = (mesh->mpoly).
                 super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                 super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_468 = (undefined1  [8])(long)pMVar3[lVar54].mat_nr;
        pmVar25 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&local_4c8,(key_type_conflict1 *)local_468);
        paVar5 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start[*pmVar25];
        paVar30 = paVar5->mFaces;
        uVar39 = paVar5->mNumFaces;
        paVar5->mNumFaces = uVar39 + 1;
        uVar45 = pMVar3[lVar54].totloop;
        paVar30[uVar39].mNumIndices = uVar45;
        puVar34 = (uint *)operator_new__((ulong)uVar45 << 2);
        paVar30[uVar39].mIndices = puVar34;
        if (pMVar3[lVar54].totloop < 1) {
LAB_004ce7d1:
          uVar39 = 8;
        }
        else {
          paVar28 = paVar5->mNormals;
          paVar50 = paVar5->mVertices;
          lVar55 = (ulong)paVar5->mNumVertices * 0xc;
          lVar51 = 0;
          do {
            lVar35 = pMVar3[lVar54].loopstart + lVar51;
            pMVar11 = (mesh->mloop).
                      super_vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>.
                      super__Vector_base<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar23 = pMVar11[lVar35].v;
            if (mesh->totvert <= iVar23) {
              local_468 = (undefined1  [8])(auStack_460 + 8);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_468,"Vertex index out of range","");
              LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
              if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
                operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
              }
              iVar23 = pMVar11[lVar35].v;
            }
            pMVar10 = (mesh->mvert).
                      super_vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>.
                      super__Vector_base<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(float *)((long)&paVar50->x + lVar55) = pMVar10[iVar23].co[0];
            *(float *)((long)&paVar50->y + lVar55) = pMVar10[iVar23].co[1];
            *(float *)((long)&paVar50->z + lVar55) = pMVar10[iVar23].co[2];
            *(float *)((long)&paVar28->x + lVar55) = pMVar10[iVar23].no[0];
            *(float *)((long)&paVar28->y + lVar55) = pMVar10[iVar23].no[1];
            *(float *)((long)&paVar28->z + lVar55) = pMVar10[iVar23].no[2];
            uVar45 = paVar5->mNumVertices;
            paVar5->mNumVertices = uVar45 + 1;
            paVar30[uVar39].mIndices[lVar51] = uVar45;
            lVar51 = lVar51 + 1;
            lVar55 = lVar55 + 0xc;
          } while (lVar51 < pMVar3[lVar54].totloop);
          uVar39 = 4;
          if (pMVar3[lVar54].totloop != 3) goto LAB_004ce7d1;
        }
        paVar5->mPrimitiveTypes = paVar5->mPrimitiveTypes | uVar39;
        lVar54 = lVar54 + 1;
      } while (lVar54 < mesh->totpoly);
    }
    _Stack_530._M_left = &_Stack_530;
    _Stack_530._0_8_ = _Stack_530._0_8_ & 0xffffffff00000000;
    _Stack_530._M_parent = (_Rb_tree_node_base *)0x0;
    local_510 = 0;
    uVar41 = (ulong)((long)(mesh->mat).
                           super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                           .
                           super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(mesh->mat).
                          super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                          .
                          super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4;
    _Stack_530._M_right = _Stack_530._M_left;
    if ((int)uVar41 != 0) {
      uVar47 = 0;
      do {
        psVar32 = (mesh->mat).
                  super_vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                  .
                  super__Vector_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar54 = (long)psVar32[uVar47].
                       super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
        this_00 = psVar32[uVar47].
                  super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_4f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_4f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_4f8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_4f8._M_impl.super__Rb_tree_header._M_header;
        local_4f8._M_impl.super__Rb_tree_header._M_node_count = 0;
        plVar44 = (long *)(lVar54 + 0x598);
        lVar54 = 0;
        local_4f8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_4f8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          lVar55 = *plVar44;
          if ((lVar55 != 0) && (*(char *)(lVar55 + 0x38) != '\0')) {
            pcVar43 = (char *)(lVar55 + 0x38);
            local_468 = (undefined1  [8])(auStack_460 + 8);
            sVar31 = strlen(pcVar43);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_468,pcVar43,pcVar43 + sVar31);
            pEVar36 = Blender::getCustomDataLayerData(&mesh->ldata,CD_MLOOPUV,(string *)local_468);
            if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
              operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
            }
            if (pEVar36 != (ElemBase *)0x0) {
              auStack_460._0_8_ =
                   __dynamic_cast(pEVar36,&Blender::ElemBase::typeinfo,&Blender::MLoopUV::typeinfo,0
                                 );
              local_468._0_4_ = (int)lVar54;
              std::
              _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>
              ::_M_emplace_unique<std::pair<unsigned_int,Assimp::Blender::MLoopUV_const*>>
                        ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>
                          *)&local_4f8,
                         (pair<unsigned_int,_const_Assimp::Blender::MLoopUV_*> *)local_468);
            }
          }
          lVar54 = lVar54 + 1;
          plVar44 = plVar44 + 2;
        } while (lVar54 != 0x12);
        if (local_4f8._M_impl.super__Rb_tree_header._M_node_count != 0) {
          local_468._0_4_ = (int)uVar47;
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
          ::_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                      *)auStack_460,&local_4f8);
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_int,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>>
                      *)local_538,
                     (pair<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>
                      *)local_468);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                       *)auStack_460);
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
        ::~_Rb_tree(&local_4f8);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        uVar47 = uVar47 + 1;
      } while (uVar47 != (uVar41 & 0xffffffff));
    }
    pMVar12 = (mesh->mtface).
              super_vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
              super__Vector_base<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar13 = (mesh->mtface).
              super_vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
              super__Vector_base<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((pMVar12 != pMVar13) ||
       ((mesh->mloopuv).
        super_vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        super__Vector_base<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (mesh->mloopuv).
        super_vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        super__Vector_base<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      if ((int)((ulong)((long)pMVar13 - (long)pMVar12) >> 3) * -0x49249249 < mesh->totface) {
        local_468 = (undefined1  [8])(auStack_460 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_468,
                   "Number of UV faces is larger than the corresponding UV face array (#1)","");
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
        if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
          operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
        }
      }
      ppaVar48 = (pointer)((long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar49);
      if (ppaVar48 !=
          (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          paVar5 = *ppaVar48;
          if (((ulong)paVar5->mNumVertices == 0) || (paVar5->mNumFaces == 0)) {
            __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                          ,0x423,
                          "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                         );
          }
          if (_Stack_530._M_parent == (_Rb_tree_node_base *)0x0) {
LAB_004ceaea:
            uVar41 = (ulong)paVar5->mNumVertices * 0xc;
            paVar28 = (aiVector3D *)operator_new__(uVar41);
            memset(paVar28,0,((uVar41 - 0xc) / 0xc) * 0xc + 0xc);
            (*ppaVar48)->mTextureCoords[0] = paVar28;
          }
          else {
            _Var24 = paVar5->mMaterialIndex;
            p_Var33 = _Stack_530._M_parent;
            p_Var53 = &_Stack_530;
            do {
              p_Var52 = p_Var53;
              p_Var42 = p_Var33;
              _Var1 = p_Var42[1]._M_color;
              p_Var53 = p_Var42;
              if (_Var1 < _Var24) {
                p_Var53 = p_Var52;
              }
              p_Var33 = (&p_Var42->_M_left)[_Var1 < _Var24];
            } while ((&p_Var42->_M_left)[_Var1 < _Var24] != (_Base_ptr)0x0);
            if (p_Var53 == &_Stack_530) goto LAB_004ceaea;
            if (_Var1 < _Var24) {
              p_Var42 = p_Var52;
            }
            if (_Var24 < p_Var42[1]._M_color) goto LAB_004ceaea;
            if (p_Var53[2]._M_left != (_Base_ptr)0x0) {
              uVar39 = 1;
              p_Var33 = (_Base_ptr)0x0;
              do {
                uVar45 = (*ppaVar48)->mNumVertices;
                uVar41 = (ulong)uVar45 * 0xc;
                paVar28 = (aiVector3D *)operator_new__(uVar41);
                if (uVar45 != 0) {
                  memset(paVar28,0,((uVar41 - 0xc) / 0xc) * 0xc + 0xc);
                }
                (*ppaVar48)->mTextureCoords[(long)p_Var33] = paVar28;
                p_Var33 = (_Base_ptr)(ulong)uVar39;
                uVar39 = uVar39 + 1;
              } while (p_Var33 < p_Var53[2]._M_left);
            }
          }
          (*ppaVar48)->mNumVertices = 0;
          (*ppaVar48)->mNumFaces = 0;
          ppaVar48 = ppaVar48 + 1;
        } while (ppaVar48 !=
                 (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (0 < mesh->totface) {
        lVar55 = 0x14;
        lVar54 = 0;
        do {
          pMVar12 = (mesh->mtface).
                    super_vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>.
                    super__Vector_base<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_468 = (undefined1  [8])
                      (long)(mesh->mface).
                            super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            .
                            super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar54].mat_nr;
          pmVar25 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar5 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar25];
          paVar30 = paVar5->mFaces;
          uVar39 = paVar5->mNumFaces;
          paVar5->mNumFaces = uVar39 + 1;
          if (paVar30[uVar39].mNumIndices != 0) {
            paVar28 = paVar5->mTextureCoords[0] + paVar5->mNumVertices;
            uVar41 = 0;
            do {
              paVar28->x = *(float *)((long)(pMVar12->uv + uVar41 + 0xfffffffffffffffd) + 4U +
                                     lVar55);
              paVar28->y = *(float *)((long)(pMVar12->uv + uVar41 + 0xfffffffffffffffe) + lVar55);
              paVar5->mNumVertices = paVar5->mNumVertices + 1;
              uVar41 = uVar41 + 1;
              paVar28 = paVar28 + 1;
            } while (uVar41 < paVar30[uVar39].mNumIndices);
          }
          lVar54 = lVar54 + 1;
          lVar55 = lVar55 + 0x38;
        } while (lVar54 < mesh->totface);
      }
      if (0 < mesh->totpoly) {
        lVar54 = 0;
        do {
          pMVar3 = (mesh->mpoly).
                   super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                   super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_468 = (undefined1  [8])(long)pMVar3[lVar54].mat_nr;
          pmVar25 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar5 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar25];
          uVar39 = paVar5->mNumFaces;
          paVar5->mNumFaces = uVar39 + 1;
          paVar30 = paVar5->mFaces + uVar39;
          if (_Stack_530._M_parent == (_Rb_tree_node_base *)0x0) {
LAB_004ced6e:
            if (paVar30->mNumIndices != 0) {
              paVar28 = paVar5->mTextureCoords[0] + paVar5->mNumVertices;
              uVar39 = 0;
              do {
                uVar45 = pMVar3[lVar54].loopstart + uVar39;
                pMVar14 = (mesh->mloopuv).
                          super_vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>
                          .
                          super__Vector_base<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                paVar28->x = pMVar14[uVar45].uv[0];
                paVar28->y = pMVar14[uVar45].uv[1];
                paVar5->mNumVertices = paVar5->mNumVertices + 1;
                uVar39 = uVar39 + 1;
                paVar28 = paVar28 + 1;
              } while (uVar39 < paVar30->mNumIndices);
            }
          }
          else {
            _Var24 = (_Rb_tree_color)pMVar3[lVar54].mat_nr;
            p_Var33 = _Stack_530._M_parent;
            p_Var53 = &_Stack_530;
            do {
              p_Var52 = p_Var53;
              p_Var42 = p_Var33;
              _Var1 = p_Var42[1]._M_color;
              p_Var53 = p_Var42;
              if (_Var1 < _Var24) {
                p_Var53 = p_Var52;
              }
              p_Var33 = (&p_Var42->_M_left)[_Var1 < _Var24];
            } while ((&p_Var42->_M_left)[_Var1 < _Var24] != (_Base_ptr)0x0);
            if (p_Var53 == &_Stack_530) goto LAB_004ced6e;
            if (_Var1 < _Var24) {
              p_Var42 = p_Var52;
            }
            if (_Var24 < p_Var42[1]._M_color) goto LAB_004ced6e;
            local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffff00000000);
            if (p_Var53[2]._M_left != (_Base_ptr)0x0) {
              do {
                ppMVar37 = std::
                           map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                           ::operator[]((map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                                         *)&p_Var53[1]._M_parent,(key_type *)local_468);
                if (paVar30->mNumIndices == 0) {
                  uVar39 = 0;
                }
                else {
                  pMVar15 = *ppMVar37;
                  lVar55 = (long)paVar5->mTextureCoords[(ulong)local_468 & 0xffffffff] +
                           (ulong)paVar5->mNumVertices * 0xc;
                  uVar39 = 0;
                  do {
                    uVar45 = pMVar3[lVar54].loopstart + uVar39;
                    *(float *)lVar55 = pMVar15[uVar45].uv[0];
                    *(float *)(lVar55 + 4) = pMVar15[uVar45].uv[1];
                    uVar39 = uVar39 + 1;
                    lVar55 = lVar55 + 0xc;
                  } while (uVar39 < paVar30->mNumIndices);
                }
                p_Var33 = p_Var53[2]._M_left;
                if ((undefined1 *)((long)&p_Var33[-1]._M_right + 7U) ==
                    (undefined1 *)((ulong)local_468 & 0xffffffff)) {
                  paVar5->mNumVertices = paVar5->mNumVertices + uVar39;
                  p_Var33 = p_Var53[2]._M_left;
                }
                uVar39 = local_468._0_4_ + 1;
                local_468._0_4_ = uVar39;
              } while ((_Base_ptr)(ulong)uVar39 < p_Var33);
            }
          }
          lVar54 = lVar54 + 1;
        } while (lVar54 < mesh->totpoly);
      }
    }
    pTVar16 = (mesh->tface).
              super_vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              super__Vector_base<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar17 = (mesh->tface).
              super_vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              super__Vector_base<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar16 != pTVar17) {
      if ((int)((ulong)((long)pTVar17 - (long)pTVar16) >> 3) * 0x38e38e39 < mesh->totface) {
        local_468 = (undefined1  [8])(auStack_460 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_468,
                   "Number of faces is larger than the corresponding UV face array (#2)","");
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
        if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
          operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
        }
      }
      ppaVar48 = (pointer)((long)(temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar49);
      if (ppaVar48 !=
          (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          uVar41 = (ulong)(*ppaVar48)->mNumVertices;
          if ((uVar41 == 0) || ((*ppaVar48)->mNumFaces == 0)) {
            __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                          ,0x469,
                          "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                         );
          }
          uVar41 = uVar41 * 0xc;
          paVar28 = (aiVector3D *)operator_new__(uVar41);
          memset(paVar28,0,((uVar41 - 0xc) / 0xc) * 0xc + 0xc);
          (*ppaVar48)->mTextureCoords[0] = paVar28;
          (*ppaVar48)->mNumVertices = 0;
          (*ppaVar48)->mNumFaces = 0;
          ppaVar48 = ppaVar48 + 1;
        } while (ppaVar48 !=
                 (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (0 < mesh->totface) {
        lVar55 = 0x14;
        lVar54 = 0;
        do {
          pTVar16 = (mesh->tface).
                    super_vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>.
                    super__Vector_base<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_468 = (undefined1  [8])
                      (long)(mesh->mface).
                            super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            .
                            super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar54].mat_nr;
          pmVar25 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar5 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar25];
          paVar30 = paVar5->mFaces;
          uVar39 = paVar5->mNumFaces;
          paVar5->mNumFaces = uVar39 + 1;
          if (paVar30[uVar39].mNumIndices != 0) {
            paVar28 = paVar5->mTextureCoords[0] + paVar5->mNumVertices;
            uVar41 = 0;
            do {
              paVar28->x = *(float *)((long)(pTVar16->uv + uVar41 + 0xfffffffffffffffd) + 4U +
                                     lVar55);
              paVar28->y = *(float *)((long)(pTVar16->uv + uVar41 + 0xfffffffffffffffe) + lVar55);
              paVar5->mNumVertices = paVar5->mNumVertices + 1;
              uVar41 = uVar41 + 1;
              paVar28 = paVar28 + 1;
            } while (uVar41 < paVar30[uVar39].mNumIndices);
          }
          lVar54 = lVar54 + 1;
          lVar55 = lVar55 + 0x48;
        } while (lVar54 < mesh->totface);
      }
    }
    pMVar18 = (mesh->mcol).
              super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar19 = (mesh->mcol).
              super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((pMVar18 != pMVar19) ||
       ((mesh->mloopcol).
        super_vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        super__Vector_base<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (mesh->mloopcol).
        super_vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        super__Vector_base<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      if ((int)(((ulong)((long)pMVar19 - (long)pMVar18) >> 3) * -0x5555555555555555 >> 2) <
          mesh->totface) {
        local_468 = (undefined1  [8])(auStack_460 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_468,
                   "Number of faces is larger than the corresponding color face array","");
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_468);
        if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
          operator_delete((void *)local_468,(ulong)(auStack_460._8_8_ + 1));
        }
      }
      ppaVar48 = (pointer)(lVar49 + (long)(temp->arr).
                                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
      if (ppaVar48 !=
          (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          uVar41 = (ulong)(*ppaVar48)->mNumVertices;
          if ((uVar41 == 0) || ((*ppaVar48)->mNumFaces == 0)) {
            __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                          ,0x483,
                          "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                         );
          }
          uVar41 = uVar41 << 4;
          paVar38 = (aiColor4D *)operator_new__(uVar41);
          memset(paVar38,0,uVar41);
          (*ppaVar48)->mColors[0] = paVar38;
          (*ppaVar48)->mNumVertices = 0;
          (*ppaVar48)->mNumFaces = 0;
          ppaVar48 = ppaVar48 + 1;
        } while (ppaVar48 !=
                 (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (0 < mesh->totface) {
        iVar23 = 0;
        lVar49 = 0;
        do {
          local_468 = (undefined1  [8])
                      (long)(mesh->mface).
                            super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            .
                            super__Vector_base<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar49].mat_nr;
          pmVar25 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar5 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar25];
          paVar30 = paVar5->mFaces;
          uVar39 = paVar5->mNumFaces;
          paVar5->mNumFaces = uVar39 + 1;
          if (paVar30[uVar39].mNumIndices != 0) {
            paVar38 = paVar5->mColors[0] + paVar5->mNumVertices;
            uVar41 = 0;
            do {
              uVar45 = iVar23 + (int)uVar41;
              pMVar18 = (mesh->mcol).
                        super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>.
                        super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              paVar38->r = (float)(int)pMVar18[uVar45].r;
              paVar38->g = (float)(int)pMVar18[uVar45].g;
              paVar38->b = (float)(int)pMVar18[uVar45].b;
              paVar38->a = (float)(int)pMVar18[uVar45].a;
              paVar5->mNumVertices = paVar5->mNumVertices + 1;
              uVar41 = uVar41 + 1;
              paVar38 = paVar38 + 1;
            } while (uVar41 < paVar30[uVar39].mNumIndices);
          }
          lVar49 = lVar49 + 1;
          iVar23 = iVar23 + 4;
        } while (lVar49 < mesh->totface);
      }
      if (0 < mesh->totpoly) {
        lVar49 = 0;
        do {
          pMVar3 = (mesh->mpoly).
                   super_vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>.
                   super__Vector_base<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_468 = (undefined1  [8])(long)pMVar3[lVar49].mat_nr;
          pmVar25 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)&local_4c8,(key_type_conflict1 *)local_468);
          paVar5 = (temp->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*pmVar25];
          paVar30 = paVar5->mFaces;
          uVar39 = paVar5->mNumFaces;
          paVar5->mNumFaces = uVar39 + 1;
          if (paVar30[uVar39].mNumIndices != 0) {
            paVar38 = paVar5->mColors[0] + paVar5->mNumVertices;
            uVar45 = 0;
            do {
              uVar46 = pMVar3[lVar49].loopstart + uVar45;
              pMVar20 = (mesh->mloopcol).
                        super_vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>
                        .
                        super__Vector_base<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              paVar38->r = (float)pMVar20[uVar46].r * 0.003921569;
              paVar38->g = (float)pMVar20[uVar46].g * 0.003921569;
              paVar38->b = (float)pMVar20[uVar46].b * 0.003921569;
              paVar38->a = (float)pMVar20[uVar46].a * 0.003921569;
              paVar5->mNumVertices = paVar5->mNumVertices + 1;
              uVar45 = uVar45 + 1;
              paVar38 = paVar38 + 1;
            } while (uVar45 < paVar30[uVar39].mNumIndices);
          }
          lVar49 = lVar49 + 1;
        } while (lVar49 < mesh->totpoly);
      }
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
                 *)local_538);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~_Rb_tree(&local_4c8);
    std::
    _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::~_Rb_tree(&local_498);
  }
  return;
}

Assistant:

void BlenderImporter::ConvertMesh(const Scene& /*in*/, const Object* /*obj*/, const Mesh* mesh,
    ConversionData& conv_data, TempArray<std::vector,aiMesh>&  temp
    )
{
    // TODO: Resolve various problems with BMesh triangulation before re-enabling.
    //       See issues #400, #373, #318  #315 and #132.
#if defined(TODO_FIX_BMESH_CONVERSION)
    BlenderBMeshConverter BMeshConverter( mesh );
    if ( BMeshConverter.ContainsBMesh( ) )
    {
        mesh = BMeshConverter.TriangulateBMesh( );
    }
#endif

    typedef std::pair<const int,size_t> MyPair;
    if ((!mesh->totface && !mesh->totloop) || !mesh->totvert) {
        return;
    }

    // some sanity checks
    if (static_cast<size_t> ( mesh->totface ) > mesh->mface.size() ){
        ThrowException("Number of faces is larger than the corresponding array");
    }

    if (static_cast<size_t> ( mesh->totvert ) > mesh->mvert.size()) {
        ThrowException("Number of vertices is larger than the corresponding array");
    }

    if (static_cast<size_t> ( mesh->totloop ) > mesh->mloop.size()) {
        ThrowException("Number of vertices is larger than the corresponding array");
    }

    // collect per-submesh numbers
    std::map<int,size_t> per_mat;
    std::map<int,size_t> per_mat_verts;
    for (int i = 0; i < mesh->totface; ++i) {

        const MFace& mf = mesh->mface[i];
        per_mat[ mf.mat_nr ]++;
        per_mat_verts[ mf.mat_nr ] += mf.v4?4:3;
    }

    for (int i = 0; i < mesh->totpoly; ++i) {
        const MPoly& mp = mesh->mpoly[i];
        per_mat[ mp.mat_nr ]++;
        per_mat_verts[ mp.mat_nr ] += mp.totloop;
    }

    // ... and allocate the corresponding meshes
    const size_t old = temp->size();
    temp->reserve(temp->size() + per_mat.size());

    std::map<size_t,size_t> mat_num_to_mesh_idx;
    for(MyPair& it : per_mat) {

        mat_num_to_mesh_idx[it.first] = temp->size();
        temp->push_back(new aiMesh());

        aiMesh* out = temp->back();
        out->mVertices = new aiVector3D[per_mat_verts[it.first]];
        out->mNormals  = new aiVector3D[per_mat_verts[it.first]];

        //out->mNumFaces = 0
        //out->mNumVertices = 0
        out->mFaces = new aiFace[it.second]();

        // all sub-meshes created from this mesh are named equally. this allows
        // curious users to recover the original adjacency.
        out->mName = aiString(mesh->id.name+2);
            // skip over the name prefix 'ME'

        // resolve the material reference and add this material to the set of
        // output materials. The (temporary) material index is the index
        // of the material entry within the list of resolved materials.
        if (mesh->mat) {

            if (static_cast<size_t> ( it.first ) >= mesh->mat.size() ) {
                ThrowException("Material index is out of range");
            }

            std::shared_ptr<Material> mat = mesh->mat[it.first];
            const std::deque< std::shared_ptr<Material> >::iterator has = std::find(
                    conv_data.materials_raw.begin(),
                    conv_data.materials_raw.end(),mat
            );

            if (has != conv_data.materials_raw.end()) {
                out->mMaterialIndex = static_cast<unsigned int>( std::distance(conv_data.materials_raw.begin(),has));
            }
            else {
                out->mMaterialIndex = static_cast<unsigned int>( conv_data.materials_raw.size() );
                conv_data.materials_raw.push_back(mat);
            }
        }
        else out->mMaterialIndex = static_cast<unsigned int>( -1 );
    }

    for (int i = 0; i < mesh->totface; ++i) {

        const MFace& mf = mesh->mface[i];

        aiMesh* const out = temp[ mat_num_to_mesh_idx[ mf.mat_nr ] ];
        aiFace& f = out->mFaces[out->mNumFaces++];

        f.mIndices = new unsigned int[ f.mNumIndices = mf.v4?4:3 ];
        aiVector3D* vo = out->mVertices + out->mNumVertices;
        aiVector3D* vn = out->mNormals + out->mNumVertices;

        // XXX we can't fold this easily, because we are restricted
        // to the member names from the BLEND file (v1,v2,v3,v4)
        // which are assigned by the genblenddna.py script and
        // cannot be changed without breaking the entire
        // import process.

        if (mf.v1 >= mesh->totvert) {
            ThrowException("Vertex index v1 out of range");
        }
        const MVert* v = &mesh->mvert[mf.v1];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[0] = out->mNumVertices++;
        ++vo;
        ++vn;

        //  if (f.mNumIndices >= 2) {
        if (mf.v2 >= mesh->totvert) {
            ThrowException("Vertex index v2 out of range");
        }
        v = &mesh->mvert[mf.v2];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[1] = out->mNumVertices++;
        ++vo;
        ++vn;

        if (mf.v3 >= mesh->totvert) {
            ThrowException("Vertex index v3 out of range");
        }
        //  if (f.mNumIndices >= 3) {
        v = &mesh->mvert[mf.v3];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[2] = out->mNumVertices++;
        ++vo;
        ++vn;

        if (mf.v4 >= mesh->totvert) {
            ThrowException("Vertex index v4 out of range");
        }
        //  if (f.mNumIndices >= 4) {
        if (mf.v4) {
            v = &mesh->mvert[mf.v4];
            vo->x = v->co[0];
            vo->y = v->co[1];
            vo->z = v->co[2];
            vn->x = v->no[0];
            vn->y = v->no[1];
            vn->z = v->no[2];
            f.mIndices[3] = out->mNumVertices++;
            ++vo;
            ++vn;

            out->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
        }
        else out->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;

        //  }
        //  }
        //  }
    }

    for (int i = 0; i < mesh->totpoly; ++i) {

        const MPoly& mf = mesh->mpoly[i];

        aiMesh* const out = temp[ mat_num_to_mesh_idx[ mf.mat_nr ] ];
        aiFace& f = out->mFaces[out->mNumFaces++];

        f.mIndices = new unsigned int[ f.mNumIndices = mf.totloop ];
        aiVector3D* vo = out->mVertices + out->mNumVertices;
        aiVector3D* vn = out->mNormals + out->mNumVertices;

        // XXX we can't fold this easily, because we are restricted
        // to the member names from the BLEND file (v1,v2,v3,v4)
        // which are assigned by the genblenddna.py script and
        // cannot be changed without breaking the entire
        // import process.
        for (int j = 0;j < mf.totloop; ++j)
        {
            const MLoop& loop = mesh->mloop[mf.loopstart + j];

            if (loop.v >= mesh->totvert) {
                ThrowException("Vertex index out of range");
            }

            const MVert& v = mesh->mvert[loop.v];

            vo->x = v.co[0];
            vo->y = v.co[1];
            vo->z = v.co[2];
            vn->x = v.no[0];
            vn->y = v.no[1];
            vn->z = v.no[2];
            f.mIndices[j] = out->mNumVertices++;

            ++vo;
            ++vn;

        }
        if (mf.totloop == 3)
        {
            out->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
        }
        else
        {
            out->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
        }
    }

    // TODO should we create the TextureUVMapping map in Convert<Material> to prevent redundant processing?

    // create texture <-> uvname mapping for all materials
    // key is texture number, value is data *
    typedef std::map<uint32_t, const MLoopUV *> TextureUVMapping;
    // key is material number, value is the TextureUVMapping for the material
    typedef std::map<uint32_t, TextureUVMapping> MaterialTextureUVMappings;
    MaterialTextureUVMappings matTexUvMappings;
    const uint32_t maxMat = static_cast<const uint32_t>(mesh->mat.size());
    for (uint32_t m = 0; m < maxMat; ++m) {
        // get material by index
        const std::shared_ptr<Material> pMat = mesh->mat[m];
        TextureUVMapping texuv;
        const uint32_t maxTex = sizeof(pMat->mtex) / sizeof(pMat->mtex[0]);
        for (uint32_t t = 0; t < maxTex; ++t) {
            if (pMat->mtex[t] && pMat->mtex[t]->uvname[0]) {
                // get the CustomData layer for given uvname and correct type
                const ElemBase *pLoop = getCustomDataLayerData(mesh->ldata, CD_MLOOPUV, pMat->mtex[t]->uvname);
                if (pLoop) {
                    texuv.insert(std::make_pair(t, dynamic_cast<const MLoopUV *>(pLoop)));
                }
            }
        }
        if (texuv.size()) {
            matTexUvMappings.insert(std::make_pair(m, texuv));
        }
    }

    // collect texture coordinates, they're stored in a separate per-face buffer
    if (mesh->mtface || mesh->mloopuv) {
        if (mesh->totface > static_cast<int> ( mesh->mtface.size())) {
            ThrowException("Number of UV faces is larger than the corresponding UV face array (#1)");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);
            const auto itMatTexUvMapping = matTexUvMappings.find((*it)->mMaterialIndex);
            if (itMatTexUvMapping == matTexUvMappings.end()) {
                // default behaviour like before
                (*it)->mTextureCoords[0] = new aiVector3D[(*it)->mNumVertices];
            }
            else {
                // create texture coords for every mapped tex
                for (uint32_t i = 0; i < itMatTexUvMapping->second.size(); ++i) {
                    (*it)->mTextureCoords[i] = new aiVector3D[(*it)->mNumVertices];
                }
            }
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {
            const MTFace* v = &mesh->mtface[i];

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
            for (unsigned int i = 0; i < f.mNumIndices; ++i,++vo,++out->mNumVertices) {
                vo->x = v->uv[i][0];
                vo->y = v->uv[i][1];
            }
        }

        for (int i = 0; i < mesh->totpoly; ++i) {
            const MPoly& v = mesh->mpoly[i];
            aiMesh* const out = temp[ mat_num_to_mesh_idx[ v.mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            const auto itMatTexUvMapping = matTexUvMappings.find(v.mat_nr);
            if (itMatTexUvMapping == matTexUvMappings.end()) {
                // old behavior
                aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
                for (unsigned int j = 0; j < f.mNumIndices; ++j, ++vo, ++out->mNumVertices) {
                    const MLoopUV& uv = mesh->mloopuv[v.loopstart + j];
                    vo->x = uv.uv[0];
                    vo->y = uv.uv[1];
                }
            }
            else {
                // create textureCoords for every mapped tex
                for (uint32_t m = 0; m < itMatTexUvMapping->second.size(); ++m) {
                    const MLoopUV *tm = itMatTexUvMapping->second[m];
                    aiVector3D* vo = &out->mTextureCoords[m][out->mNumVertices];
                    uint32_t j = 0;
                    for (; j < f.mNumIndices; ++j, ++vo) {
                        const MLoopUV& uv = tm[v.loopstart + j];
                        vo->x = uv.uv[0];
                        vo->y = uv.uv[1];
                    }
                    // only update written mNumVertices in last loop
                    // TODO why must the numVertices be incremented here?
                    if (m == itMatTexUvMapping->second.size() - 1) {
                        out->mNumVertices += j;
                    }
                }
            }
        }
    }

    // collect texture coordinates, old-style (marked as deprecated in current blender sources)
    if (mesh->tface) {
        if (mesh->totface > static_cast<int> ( mesh->tface.size())) {
            ThrowException("Number of faces is larger than the corresponding UV face array (#2)");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);

            (*it)->mTextureCoords[0] = new aiVector3D[(*it)->mNumVertices];
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {
            const TFace* v = &mesh->tface[i];

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
            for (unsigned int i = 0; i < f.mNumIndices; ++i,++vo,++out->mNumVertices) {
                vo->x = v->uv[i][0];
                vo->y = v->uv[i][1];
            }
        }
    }

    // collect vertex colors, stored separately as well
    if (mesh->mcol || mesh->mloopcol) {
        if (mesh->totface > static_cast<int> ( (mesh->mcol.size()/4)) ) {
            ThrowException("Number of faces is larger than the corresponding color face array");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);

            (*it)->mColors[0] = new aiColor4D[(*it)->mNumVertices];
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiColor4D* vo = &out->mColors[0][out->mNumVertices];
            for (unsigned int n = 0; n < f.mNumIndices; ++n, ++vo,++out->mNumVertices) {
                const MCol* col = &mesh->mcol[(i<<2)+n];

                vo->r = col->r;
                vo->g = col->g;
                vo->b = col->b;
                vo->a = col->a;
            }
            for (unsigned int n = f.mNumIndices; n < 4; ++n);
        }

        for (int i = 0; i < mesh->totpoly; ++i) {
            const MPoly& v = mesh->mpoly[i];
            aiMesh* const out = temp[ mat_num_to_mesh_idx[ v.mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiColor4D* vo = &out->mColors[0][out->mNumVertices];
			const ai_real scaleZeroToOne = 1.f/255.f;
            for (unsigned int j = 0; j < f.mNumIndices; ++j,++vo,++out->mNumVertices) {
                const MLoopCol& col = mesh->mloopcol[v.loopstart + j];
                vo->r = ai_real(col.r) * scaleZeroToOne;
                vo->g = ai_real(col.g) * scaleZeroToOne;
                vo->b = ai_real(col.b) * scaleZeroToOne;
                vo->a = ai_real(col.a) * scaleZeroToOne;
            }

        }

    }

    return;
}